

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_mark_start(global_State *g)

{
  long in_RDI;
  GCobj *in_stack_00000008;
  global_State *in_stack_00000010;
  
  *(undefined4 *)(in_RDI + 0x38) = 0;
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  if ((*(byte *)((ulong)*(uint *)(in_RDI + 0x94) + 4) & 3) != 0) {
    gc_mark(in_stack_00000010,in_stack_00000008);
  }
  if ((*(byte *)((ulong)*(uint *)((ulong)*(uint *)(in_RDI + 0x94) + 0x2c) + 4) & 3) != 0) {
    gc_mark(in_stack_00000010,in_stack_00000008);
  }
  if ((0xfffffff6 < *(int *)(in_RDI + 0x9c) + 4U) &&
     ((*(byte *)((ulong)*(uint *)(in_RDI + 0x98) + 4) & 3) != 0)) {
    gc_mark(in_stack_00000010,in_stack_00000008);
  }
  gc_mark_gcroot(g);
  *(undefined1 *)(in_RDI + 0x29) = 1;
  return;
}

Assistant:

static void gc_mark_start(global_State *g)
{
  setgcrefnull(g->gc.gray);
  setgcrefnull(g->gc.grayagain);
  setgcrefnull(g->gc.weak);
  gc_markobj(g, mainthread(g));
  gc_markobj(g, tabref(mainthread(g)->env));
  gc_marktv(g, &g->registrytv);
  gc_mark_gcroot(g);
  g->gc.state = GCSpropagate;
}